

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

void disconnect_cpu_mapping_from_gpu_object(cpu_mapping *cpu_mapping)

{
  cpu_mapping *pcVar1;
  cpu_mapping **ppcVar2;
  cpu_mapping *pcVar3;
  cpu_mapping **ppcVar4;
  
  ppcVar2 = &cpu_mapping->object->cpu_mappings;
  pcVar3 = (cpu_mapping *)0x0;
  ppcVar4 = ppcVar2;
  while( true ) {
    pcVar1 = *ppcVar4;
    if (pcVar1 == (cpu_mapping *)0x0) {
      fprintf(_stdout,"ERROR: can\'t find cpu_mapping on object\'s cpu_mappings list%s\n","");
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
      demmt_abort();
    }
    if (pcVar1 == cpu_mapping) break;
    ppcVar4 = &pcVar1->next;
    pcVar3 = pcVar1;
  }
  ppcVar4 = &pcVar3->next;
  if (pcVar3 == (cpu_mapping *)0x0) {
    ppcVar4 = ppcVar2;
  }
  *ppcVar4 = pcVar1->next;
  pcVar1->next = (cpu_mapping *)0x0;
  cpu_mapping->object = (gpu_object *)0x0;
  cpu_mapping->object_offset = 0;
  cpu_mapping->data = (uint8_t *)0x0;
  if (max_id < cpu_mapping->id || max_id == 0xffffffff) {
    pcVar3 = (cpu_mapping *)0x0;
  }
  else {
    pcVar3 = cpu_mappings[cpu_mapping->id];
  }
  if (pcVar3 != cpu_mapping) {
    free(cpu_mapping);
    return;
  }
  return;
}

Assistant:

void disconnect_cpu_mapping_from_gpu_object(struct cpu_mapping *cpu_mapping)
{
	struct gpu_object *obj = cpu_mapping->object;
	struct cpu_mapping *it, *prev = NULL;
	for (it = obj->cpu_mappings; it != NULL; prev = it, it = it->next)
		if (it == cpu_mapping)
		{
			if (prev)
				prev->next = it->next;
			else
				obj->cpu_mappings = it->next;
			it->next = NULL;
			cpu_mapping->object = NULL;
			cpu_mapping->object_offset = 0;
			cpu_mapping->data = NULL;

			if (get_cpu_mapping(cpu_mapping->id) != cpu_mapping)
				free(cpu_mapping);

			return;
		}
	mmt_error("can't find cpu_mapping on object's cpu_mappings list%s\n", "");
	demmt_abort();
}